

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseEndLabelOpt(WastParser *this,string *begin_label)

{
  Location loc_00;
  bool bVar1;
  Result result;
  ulong uVar2;
  char *format;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_60 [8];
  string end_label;
  Location loc;
  string *begin_label_local;
  WastParser *this_local;
  
  GetLocation((Location *)((long)&end_label.field_2 + 8),this);
  std::__cxx11::string::string((string *)local_60);
  result = ParseLabelOpt(this,(string *)local_60);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    uVar2 = std::__cxx11::string::empty((string *)local_60);
    if ((uVar2 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty((string *)begin_label);
      uStack_90 = SUB84(loc.filename.data_,0);
      uStack_8c = (undefined4)((ulong)loc.filename.data_ >> 0x20);
      local_88 = (undefined4)loc.filename.size_;
      uStack_84 = (undefined4)(loc.filename.size_ >> 0x20);
      uStack_80 = loc.field_1._0_4_;
      uStack_7c = loc.field_1._4_4_;
      if ((uVar2 & 1) == 0) {
        bVar1 = std::operator!=(begin_label,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60);
        if (bVar1) {
          uVar3 = std::__cxx11::string::c_str((string *)begin_label);
          uVar4 = std::__cxx11::string::c_str((string *)local_60);
          loc_00.filename.size_._0_4_ = uStack_90;
          loc_00.filename.data_ = (char *)end_label.field_2._8_8_;
          loc_00.filename.size_._4_4_ = uStack_8c;
          loc_00.field_1.field_0.line = local_88;
          loc_00.field_1.field_0.first_column = uStack_84;
          loc_00.field_1.field_0.last_column = uStack_80;
          loc_00.field_1._12_4_ = uStack_7c;
          Error(this,loc_00,"mismatching label \"%s\" != \"%s\"",uVar3,uVar4,in_R8,in_R9);
        }
      }
      else {
        format = (char *)std::__cxx11::string::c_str((string *)local_60);
        Error(this,0x19b51df,format);
      }
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::__cxx11::string::~string((string *)local_60);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseEndLabelOpt(const std::string& begin_label) {
  WABT_TRACE(ParseEndLabelOpt);
  Location loc = GetLocation();
  std::string end_label;
  CHECK_RESULT(ParseLabelOpt(&end_label));
  if (!end_label.empty()) {
    if (begin_label.empty()) {
      Error(loc, "unexpected label \"%s\"", end_label.c_str());
    } else if (begin_label != end_label) {
      Error(loc, "mismatching label \"%s\" != \"%s\"", begin_label.c_str(),
            end_label.c_str());
    }
  }
  return Result::Ok;
}